

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O1

void pfr_free(PortFwdRecord *pfr)

{
  PortListener *ptr;
  
  ptr = pfr->local;
  if (ptr != (PortListener *)0x0) {
    (*ptr->s->vt->close)(ptr->s);
    safefree(ptr->hostname);
    safefree(ptr);
  }
  safefree(pfr->saddr);
  safefree(pfr->daddr);
  safefree(pfr->sserv);
  safefree(pfr->dserv);
  safefree(pfr);
  return;
}

Assistant:

static void pfr_free(PortFwdRecord *pfr)
{
    /* Dispose of any listening socket. */
    if (pfr->local)
        pfl_terminate(pfr->local);

    sfree(pfr->saddr);
    sfree(pfr->daddr);
    sfree(pfr->sserv);
    sfree(pfr->dserv);
    sfree(pfr);
}